

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3CodeRhsOfIN(Parse *pParse,Expr *pExpr,int iTab)

{
  byte *pbVar1;
  Vdbe *p;
  ExprList *pEVar2;
  Expr *pEVar3;
  undefined8 uVar4;
  u8 uVar5;
  byte bVar6;
  int iVar7;
  undefined4 extraout_var;
  KeyInfo *zP4;
  Select *pSVar8;
  undefined4 extraout_var_00;
  Expr *pLeft;
  CollSeq *pCVar9;
  int iVar10;
  Select *pSVar11;
  Op *pOVar12;
  int p3;
  ExprList_item *pEVar13;
  int iVar14;
  ExprList **ppEVar15;
  uint uVar16;
  ulong uVar17;
  char affinity;
  SelectDest dest;
  char local_a1;
  Parse *local_a0;
  int local_94;
  undefined8 local_90;
  undefined8 local_88;
  Expr *local_80;
  KeyInfo *local_78;
  int local_6c;
  Walker local_68;
  Expr *local_38;
  
  p = pParse->pVdbe;
  uVar16 = pExpr->flags;
  local_90 = 0;
  local_94 = iTab;
  if (((uVar16 & 0x40) == 0) && (pParse->iSelfTab == 0)) {
    if ((uVar16 >> 0x19 & 1) != 0) {
      iVar10 = sqlite3VdbeAddOp3(p,0xf,0,0,0);
      if ((pExpr->flags & 0x1000) != 0) {
        sqlite3VdbeExplain(pParse,'\0',"REUSE LIST SUBQUERY %d",(ulong)((pExpr->x).pSelect)->selId);
      }
      sqlite3VdbeAddOp3(p,10,(pExpr->y).sub.regReturn,(pExpr->y).sub.iAddr,0);
      sqlite3VdbeAddOp3(p,0x73,local_94,pExpr->iTable,0);
      if (p->db->mallocFailed == '\0') {
        pOVar12 = p->aOp + iVar10;
      }
      else {
        pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar12->p2 = p->nOp;
      return;
    }
    pExpr->flags = uVar16 | 0x2000000;
    iVar10 = pParse->nMem + 1;
    pParse->nMem = iVar10;
    (pExpr->y).sub.regReturn = iVar10;
    iVar10 = sqlite3VdbeAddOp3(p,0x4a,0,iVar10,0);
    (pExpr->y).sub.iAddr = iVar10 + 1;
    iVar10 = sqlite3VdbeAddOp3(p,0xf,0,0,0);
    local_90 = CONCAT44(extraout_var,iVar10);
  }
  pSVar8 = (Select *)pExpr->pLeft;
  uVar5 = pSVar8->op;
  if (uVar5 == 0xb0) {
    uVar5 = *(u8 *)&pSVar8->nSelectRow;
  }
  pSVar11 = pSVar8;
  if (uVar5 != 0xb1) {
    uVar16 = 1;
    if (uVar5 != 0x8a) goto LAB_0018a16c;
    pSVar11 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar8->pEList)->pSelect;
  }
  uVar16 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar11->pEList)->pList->nExpr;
LAB_0018a16c:
  pExpr->iTable = local_94;
  local_6c = sqlite3VdbeAddOp3(p,0x76,local_94,uVar16,0);
  zP4 = sqlite3KeyInfoAlloc(pParse->db,uVar16,1);
  pSVar11 = (Select *)(pExpr->x).pList;
  local_80 = pExpr;
  if ((pExpr->flags & 0x1000) == 0) {
    if (pSVar11 != (Select *)0x0) {
      local_a1 = sqlite3ExprAffinity((Expr *)pSVar8);
      if (local_a1 < 'A') {
        local_a1 = 'A';
      }
      else if (local_a1 == 'E') {
        local_a1 = 'C';
      }
      if (zP4 != (KeyInfo *)0x0) {
        pCVar9 = sqlite3ExprCollSeq(pParse,local_80->pLeft);
        zP4->aColl[0] = pCVar9;
      }
      if (pParse->nTempReg == '\0') {
        iVar10 = pParse->nMem + 1;
        pParse->nMem = iVar10;
      }
      else {
        bVar6 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar6;
        iVar10 = pParse->aTempReg[bVar6];
      }
      if (pParse->nTempReg == '\0') {
        p3 = pParse->nMem + 1;
        pParse->nMem = p3;
      }
      else {
        bVar6 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar6;
        p3 = pParse->aTempReg[bVar6];
      }
      local_a0 = pParse;
      local_78 = zP4;
      if (0 < *(int *)pSVar11) {
        ppEVar15 = (ExprList **)&pSVar11->iLimit;
        iVar14 = *(int *)pSVar11 + 1;
        local_88 = CONCAT44(local_88._4_4_,p3);
        do {
          pEVar3 = (Expr *)*ppEVar15;
          if ((int)local_90 == 0) {
LAB_0018a468:
            local_90 = 0;
          }
          else {
            local_68.eCode = 1;
            local_68.xExprCallback._0_4_ = 0x188d38;
            local_68.xExprCallback._4_4_ = 0;
            local_68.xSelectCallback._0_4_ = 0x188e1a;
            local_68.xSelectCallback._4_4_ = 0;
            local_68.u.n = 0;
            if (pEVar3 != (Expr *)0x0) {
              walkExpr(&local_68,pEVar3);
            }
            if (local_68.eCode == 0) {
              iVar7 = (int)local_90;
              sqlite3VdbeChangeToNoop(p,iVar7 + -1);
              p3 = (int)local_88;
              sqlite3VdbeChangeToNoop(p,iVar7);
              pbVar1 = (byte *)((long)&local_80->flags + 3);
              *pbVar1 = *pbVar1 & 0xfd;
              goto LAB_0018a468;
            }
          }
          sqlite3ExprCode(local_a0,pEVar3,iVar10);
          iVar7 = sqlite3VdbeAddOp3(p,0x61,iVar10,1,p3);
          sqlite3VdbeChangeP4(p,iVar7,&local_a1,1);
          iVar7 = sqlite3VdbeAddOp3(p,0x8a,local_94,p3,iVar10);
          if (p->db->mallocFailed == '\0') {
            pOVar12 = p->aOp;
            pOVar12[iVar7].p4type = -3;
            pOVar12[iVar7].p4.i = 1;
          }
          ppEVar15 = ppEVar15 + 3;
          iVar14 = iVar14 + -1;
        } while (1 < iVar14);
      }
      if (iVar10 != 0) {
        bVar6 = local_a0->nTempReg;
        if ((ulong)bVar6 < 8) {
          local_a0->nTempReg = bVar6 + 1;
          local_a0->aTempReg[bVar6] = iVar10;
        }
      }
      pParse = local_a0;
      zP4 = local_78;
      if (p3 != 0) {
        bVar6 = local_a0->nTempReg;
        if ((ulong)bVar6 < 8) {
          local_a0->nTempReg = bVar6 + 1;
          local_a0->aTempReg[bVar6] = p3;
        }
      }
    }
  }
  else {
    pEVar2 = pSVar11->pEList;
    local_78 = zP4;
    local_38 = (Expr *)pSVar8;
    sqlite3VdbeExplain(pParse,'\x01',"%sLIST SUBQUERY %d");
    zP4 = local_78;
    if (pEVar2->nExpr == uVar16) {
      local_68.pParse._0_1_ = 0xb;
      local_68.pParse._4_4_ = local_94;
      local_68.xExprCallback._0_4_ = 0;
      local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
      local_68.xExprCallback._4_4_ = 0;
      local_68.xSelectCallback._0_4_ = 0;
      local_68.xSelectCallback2 =
           (_func_void_Walker_ptr_Select_ptr *)exprINAffinity(pParse,local_80);
      local_88 = 0;
      pSVar11->iLimit = 0;
      pSVar8 = sqlite3SelectDup(pParse->db,pSVar11,0);
      local_a0 = pParse;
      if (pParse->db->mallocFailed == '\0') {
        iVar10 = sqlite3Select(pParse,pSVar8,(SelectDest *)&local_68);
        local_88 = CONCAT71((int7)(CONCAT44(extraout_var_00,iVar10) >> 8),iVar10 == 0);
      }
      zP4 = local_78;
      if (pSVar8 != (Select *)0x0) {
        clearSelect(local_a0->db,pSVar8,1);
      }
      uVar4 = local_88;
      if (local_68.xSelectCallback2 != (_func_void_Walker_ptr_Select_ptr *)0x0) {
        sqlite3DbFreeNN(local_a0->db,local_68.xSelectCallback2);
      }
      pEVar3 = local_38;
      if ((char)uVar4 == '\0') {
        if ((zP4 != (KeyInfo *)0x0) && (zP4->nRef = zP4->nRef - 1, zP4->nRef == 0)) {
          sqlite3DbNNFreeNN(zP4->db,zP4);
        }
      }
      else if (0 < (int)uVar16) {
        pEVar13 = pEVar2->a;
        uVar17 = 0;
        do {
          pLeft = sqlite3VectorFieldSubexpr(pEVar3,(int)uVar17);
          pCVar9 = sqlite3BinaryCompareCollSeq(local_a0,pLeft,pEVar13->pExpr);
          zP4->aColl[uVar17] = pCVar9;
          uVar17 = uVar17 + 1;
          pEVar13 = pEVar13 + 1;
        } while (uVar16 != uVar17);
      }
      pParse = local_a0;
      if ((char)local_88 == '\0') {
        return;
      }
    }
  }
  if (zP4 != (KeyInfo *)0x0) {
    sqlite3VdbeChangeP4(p,local_6c,(char *)zP4,-8);
  }
  if ((int)local_90 != 0) {
    sqlite3VdbeAddOp3(p,0x88,local_94,0,0);
    if (p->db->mallocFailed == '\0') {
      pOVar12 = p->aOp + (int)local_90;
    }
    else {
      pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar12->p2 = p->nOp;
    sqlite3VdbeAddOp3(p,0x43,(local_80->y).sub.regReturn,(local_80->y).sub.iAddr,1);
    pParse->nTempReg = '\0';
    pParse->nRangeReg = 0;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeRhsOfIN(
  Parse *pParse,          /* Parsing context */
  Expr *pExpr,            /* The IN operator */
  int iTab                /* Use this cursor number */
){
  int addrOnce = 0;           /* Address of the OP_Once instruction at top */
  int addr;                   /* Address of OP_OpenEphemeral instruction */
  Expr *pLeft;                /* the LHS of the IN operator */
  KeyInfo *pKeyInfo = 0;      /* Key information */
  int nVal;                   /* Size of vector pLeft */
  Vdbe *v;                    /* The prepared statement under construction */

  v = pParse->pVdbe;
  assert( v!=0 );

  /* The evaluation of the IN must be repeated every time it
  ** is encountered if any of the following is true:
  **
  **    *  The right-hand side is a correlated subquery
  **    *  The right-hand side is an expression list containing variables
  **    *  We are inside a trigger
  **
  ** If all of the above are false, then we can compute the RHS just once
  ** and reuse it many names.
  */
  if( !ExprHasProperty(pExpr, EP_VarSelect) && pParse->iSelfTab==0 ){
    /* Reuse of the RHS is allowed */
    /* If this routine has already been coded, but the previous code
    ** might not have been invoked yet, so invoke it now as a subroutine.
    */
    if( ExprHasProperty(pExpr, EP_Subrtn) ){
      addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
      if( ExprUseXSelect(pExpr) ){
        ExplainQueryPlan((pParse, 0, "REUSE LIST SUBQUERY %d",
              pExpr->x.pSelect->selId));
      }
      assert( ExprUseYSub(pExpr) );
      sqlite3VdbeAddOp2(v, OP_Gosub, pExpr->y.sub.regReturn,
                        pExpr->y.sub.iAddr);
      assert( iTab!=pExpr->iTable );
      sqlite3VdbeAddOp2(v, OP_OpenDup, iTab, pExpr->iTable);
      sqlite3VdbeJumpHere(v, addrOnce);
      return;
    }

    /* Begin coding the subroutine */
    assert( !ExprUseYWin(pExpr) );
    ExprSetProperty(pExpr, EP_Subrtn);
    assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
    pExpr->y.sub.regReturn = ++pParse->nMem;
    pExpr->y.sub.iAddr =
      sqlite3VdbeAddOp2(v, OP_BeginSubrtn, 0, pExpr->y.sub.regReturn) + 1;

    addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
  }

  /* Check to see if this is a vector IN operator */
  pLeft = pExpr->pLeft;
  nVal = sqlite3ExprVectorSize(pLeft);

  /* Construct the ephemeral table that will contain the content of
  ** RHS of the IN operator.
  */
  pExpr->iTable = iTab;
  addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, pExpr->iTable, nVal);
#ifdef SQLITE_ENABLE_EXPLAIN_COMMENTS
  if( ExprUseXSelect(pExpr) ){
    VdbeComment((v, "Result of SELECT %u", pExpr->x.pSelect->selId));
  }else{
    VdbeComment((v, "RHS of IN operator"));
  }
#endif
  pKeyInfo = sqlite3KeyInfoAlloc(pParse->db, nVal, 1);

  if( ExprUseXSelect(pExpr) ){
    /* Case 1:     expr IN (SELECT ...)
    **
    ** Generate code to write the results of the select into the temporary
    ** table allocated and opened above.
    */
    Select *pSelect = pExpr->x.pSelect;
    ExprList *pEList = pSelect->pEList;

    ExplainQueryPlan((pParse, 1, "%sLIST SUBQUERY %d",
        addrOnce?"":"CORRELATED ", pSelect->selId
    ));
    /* If the LHS and RHS of the IN operator do not match, that
    ** error will have been caught long before we reach this point. */
    if( ALWAYS(pEList->nExpr==nVal) ){
      Select *pCopy;
      SelectDest dest;
      int i;
      int rc;
      sqlite3SelectDestInit(&dest, SRT_Set, iTab);
      dest.zAffSdst = exprINAffinity(pParse, pExpr);
      pSelect->iLimit = 0;
      testcase( pSelect->selFlags & SF_Distinct );
      testcase( pKeyInfo==0 ); /* Caused by OOM in sqlite3KeyInfoAlloc() */
      pCopy = sqlite3SelectDup(pParse->db, pSelect, 0);
      rc = pParse->db->mallocFailed ? 1 :sqlite3Select(pParse, pCopy, &dest);
      sqlite3SelectDelete(pParse->db, pCopy);
      sqlite3DbFree(pParse->db, dest.zAffSdst);
      if( rc ){
        sqlite3KeyInfoUnref(pKeyInfo);
        return;
      }
      assert( pKeyInfo!=0 ); /* OOM will cause exit after sqlite3Select() */
      assert( pEList!=0 );
      assert( pEList->nExpr>0 );
      assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
      for(i=0; i<nVal; i++){
        Expr *p = sqlite3VectorFieldSubexpr(pLeft, i);
        pKeyInfo->aColl[i] = sqlite3BinaryCompareCollSeq(
            pParse, p, pEList->a[i].pExpr
        );
      }
    }
  }else if( ALWAYS(pExpr->x.pList!=0) ){
    /* Case 2:     expr IN (exprlist)
    **
    ** For each expression, build an index key from the evaluation and
    ** store it in the temporary table. If <expr> is a column, then use
    ** that columns affinity when building index keys. If <expr> is not
    ** a column, use numeric affinity.
    */
    char affinity;            /* Affinity of the LHS of the IN */
    int i;
    ExprList *pList = pExpr->x.pList;
    struct ExprList_item *pItem;
    int r1, r2;
    affinity = sqlite3ExprAffinity(pLeft);
    if( affinity<=SQLITE_AFF_NONE ){
      affinity = SQLITE_AFF_BLOB;
    }else if( affinity==SQLITE_AFF_REAL ){
      affinity = SQLITE_AFF_NUMERIC;
    }
    if( pKeyInfo ){
      assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
      pKeyInfo->aColl[0] = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
    }

    /* Loop through each expression in <exprlist>. */
    r1 = sqlite3GetTempReg(pParse);
    r2 = sqlite3GetTempReg(pParse);
    for(i=pList->nExpr, pItem=pList->a; i>0; i--, pItem++){
      Expr *pE2 = pItem->pExpr;

      /* If the expression is not constant then we will need to
      ** disable the test that was generated above that makes sure
      ** this code only executes once.  Because for a non-constant
      ** expression we need to rerun this code each time.
      */
      if( addrOnce && !sqlite3ExprIsConstant(pE2) ){
        sqlite3VdbeChangeToNoop(v, addrOnce-1);
        sqlite3VdbeChangeToNoop(v, addrOnce);
        ExprClearProperty(pExpr, EP_Subrtn);
        addrOnce = 0;
      }

      /* Evaluate the expression and insert it into the temp table */
      sqlite3ExprCode(pParse, pE2, r1);
      sqlite3VdbeAddOp4(v, OP_MakeRecord, r1, 1, r2, &affinity, 1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iTab, r2, r1, 1);
    }
    sqlite3ReleaseTempReg(pParse, r1);
    sqlite3ReleaseTempReg(pParse, r2);
  }
  if( pKeyInfo ){
    sqlite3VdbeChangeP4(v, addr, (void *)pKeyInfo, P4_KEYINFO);
  }
  if( addrOnce ){
    sqlite3VdbeAddOp1(v, OP_NullRow, iTab);
    sqlite3VdbeJumpHere(v, addrOnce);
    /* Subroutine return */
    assert( ExprUseYSub(pExpr) );
    assert( sqlite3VdbeGetOp(v,pExpr->y.sub.iAddr-1)->opcode==OP_BeginSubrtn
            || pParse->nErr );
    sqlite3VdbeAddOp3(v, OP_Return, pExpr->y.sub.regReturn,
                      pExpr->y.sub.iAddr, 1);
    VdbeCoverage(v);
    sqlite3ClearTempRegCache(pParse);
  }
}